

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

MapcodeError decoderEngine(DecodeRec *dec,int parseFlags)

{
  char *__s;
  char cVar1;
  undefined1 uVar2;
  Territory TVar3;
  bool bVar4;
  bool bVar5;
  MapcodeError MVar6;
  int iVar7;
  Territory TVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  size_t sVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  Point32 PVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint maxLon32;
  ulong uVar23;
  ulong uVar24;
  int *piVar25;
  TerritoryBoundary *pTVar26;
  int iVar27;
  int iVar28;
  MapcodeZone *pMVar29;
  long lVar30;
  double dVar31;
  double dVar32;
  Point PVar33;
  uint local_d0;
  char input [8];
  double local_a8;
  double dStack_a0;
  int GOODROUNDER;
  undefined8 local_88;
  double dStack_80;
  MapcodeZone z;
  int local_38;
  int local_34;
  
  MVar6 = parseMapcodeString(&dec->mapcodeElements,dec->orginput,parseFlags,dec->context);
  if (MVar6 != ERR_OK) {
    (dec->mapcodeElements).territoryISO[0] = '\0';
    (dec->mapcodeElements).properMapcode[0] = '\0';
    (dec->mapcodeElements).precisionExtension[0] = '\0';
    return MVar6;
  }
  TVar3 = (dec->mapcodeElements).territoryCode;
  dec->context = TVar3;
  __s = (dec->mapcodeElements).properMapcode;
  dec->mapcode = __s;
  dec->extension = (dec->mapcodeElements).precisionExtension;
  iVar27 = (dec->mapcodeElements).indexOfDot * 9;
  sVar12 = strlen(__s);
  pcVar13 = strchr(__s,0x41);
  if (((pcVar13 == (char *)0x0) && (pcVar13 = strchr(__s,0x45), pcVar13 == (char *)0x0)) &&
     (pcVar13 = strchr(__s,0x55), pcVar13 == (char *)0x0)) {
    bVar5 = true;
  }
  else {
    iVar7 = unpackIfAllDigits(__s);
    if (iVar7 < 1) {
      return ERR_INVALID_VOWEL;
    }
    bVar5 = false;
  }
  iVar7 = iVar27 + (int)sVar12;
  if (0x37 < iVar7) {
    return ERR_MAPCODE_UNDECODABLE;
  }
  uVar15 = ((int)sVar12 + iVar27) - 1;
  TVar8 = TERRITORY_AAA;
  if (uVar15 != 0x36) {
    if (TVar3 < _TERRITORY_MIN) {
      return ERR_MISSING_TERRITORY;
    }
    TVar8 = TVar3;
    if (0xfffffdea < (uint)(TVar3 + ~TERRITORY_AAA)) {
      uVar24 = (ulong)(uint)(TVar3 + ~_TERRITORY_MIN);
      if ((long)""[uVar24] != 0) {
        if (iVar7 == 0x23) {
LAB_001cdf72:
          if (0x23 < uVar24 - 0x10f && 0x1f < uVar24 - 0xe9) goto LAB_001cdf9b;
        }
        else if (iVar7 != 0x2d) {
          if (iVar7 != 0x2c) goto LAB_001cdf9b;
          goto LAB_001cdf72;
        }
        TVar8 = PARENT_NR[""[uVar24]];
      }
    }
  }
LAB_001cdf9b:
  uVar23 = (ulong)*(int *)("" + (long)TVar8 * 4 + 0x28c);
  iVar27 = *(int *)("" + (long)TVar8 * 4 + 0x290);
  lVar17 = (long)iVar27 + -1;
  piVar25 = &TERRITORY_BOUNDARIES[uVar23].flags;
  lVar30 = uVar23 << 0x20;
  local_88 = (double)(CONCAT44(local_88._4_4_,uVar15) ^ 0x16);
  local_d0 = uVar15 ^ 0x17;
  for (uVar24 = uVar23; (long)uVar24 < (long)iVar27; uVar24 = uVar24 + 1) {
    iVar28 = (int)uVar24;
    uVar9 = coDex(iVar28);
    uVar16 = *piVar25;
    uVar10 = uVar16 >> 7 & 3;
    if (uVar10 == 1) {
      if ((iVar7 == uVar9 + 0xb) &&
         ("0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[uVar16 >> 0xb & 0x1f] == *__s)) {
        MVar6 = decodeGrid(dec,iVar28,1);
        goto LAB_001ce7d4;
      }
    }
    else if (uVar10 == 0) {
      if ((uVar16 & 0x40) == 0) {
        if ((uVar9 == uVar15) || (uVar9 == 0x15 && (int)local_88 == 0)) {
          MVar6 = decodeGrid(dec,iVar28,0);
          pMVar29 = &dec->zone;
          restrictZoneTo(pMVar29,pMVar29,TERRITORY_BOUNDARIES + lVar17);
          if (MVar6 != ERR_OK) goto LAB_001ce47b;
          if ((uVar16 >> 9 & 1) == 0) goto LAB_001ce7ec;
          pTVar26 = (TerritoryBoundary *)(piVar25 + -9);
          PVar33 = getMidPointFractions(pMVar29);
          local_a8 = PVar33.lon;
          dec->result = PVar33;
          dVar31 = floor(PVar33.lat / 810000.0);
          PVar19.latMicroDeg = (int)dVar31;
          dVar31 = floor(local_a8 / 3240000.0);
          PVar19.lonMicroDeg = (int)dVar31;
          dec->coord32 = PVar19;
          goto LAB_001ce53e;
        }
      }
      else if (((uVar9 == 0x15 && (int)local_88 == 0) || (uVar9 == 0x16 && uVar15 == 0x20)) ||
              (uVar9 == 0xd && local_d0 == 0)) {
        pcVar13 = dec->mapcode;
        sVar12 = strlen(pcVar13);
        iVar27 = (int)sVar12;
        if (iVar27 - 7U < 0xfffffffe) {
          MVar6 = ERR_BAD_MAPCODE_LENGTH;
          goto LAB_001ce7d4;
        }
        strcpy(input,pcVar13);
        strcpy(input + (ulong)(uVar9 == 0x16) + 2,pcVar13 + (ulong)(uVar9 == 0x16) + 3);
        iVar7 = *(int *)("" + (long)dec->context * 4 + 0x28c);
        iVar11 = countNamelessRecords(iVar28,iVar7);
        iVar7 = firstNamelessRecord(iVar28,iVar7);
        lVar30 = 0x1f / (long)iVar11;
        uVar15 = (uint)(0x1f % (long)iVar11);
        strcpy((char *)&z,input);
        iVar28 = (int)lVar30;
        if ((uVar9 == 0x15) || (0x1f < iVar11)) {
          if ((uVar9 == 0x15) || (0x3d < iVar11)) {
            lVar30 = 0x1b4d89f;
            if (uVar9 == 0x15) {
              lVar30 = 0xe1781;
            }
            iVar27 = (int)(lVar30 / (long)iVar11);
            if (iVar11 == 0x3e) {
              iVar27 = iVar27 + 1;
            }
            else {
              iVar27 = iVar27 - (int)((long)((ulong)(uint)(iVar27 >> 0x1f) << 0x20 |
                                            lVar30 / (long)iVar11 & 0xffffffffU) % 0x3c1);
            }
            iVar18 = decodeBase31((char *)&z);
            uVar16 = iVar18 / iVar27;
            iVar18 = iVar18 % iVar27;
          }
          else {
            uVar16 = (uint)(char)decodeChar_decode_chars[z.fminy._0_1_];
            if ((int)uVar16 < 0x3e - iVar11) {
              if (uVar9 == 0x16) goto LAB_001ce61f;
            }
            else {
              uVar16 = iVar11 + -0x3e + uVar16 * 2;
            }
LAB_001ce6ba:
            iVar18 = 0;
          }
          if (((uVar9 != 0x15) && (iVar11 < 0x3e)) &&
             (iVar18 = decodeBase31((char *)((long)&z.fminy + 1)),
             0x745ef < iVar18 && 0x3e - iVar11 <= (int)uVar16)) {
            iVar18 = iVar18 + -0x745f0;
            uVar16 = uVar16 + 1;
          }
        }
        else {
          cVar1 = decodeChar_decode_chars[z.fminy._0_1_];
          iVar18 = uVar15 * (iVar28 + 1);
          uVar16 = cVar1 - iVar18;
          if (cVar1 < iVar18) {
            uVar16 = (uint)(short)((short)cVar1 / (short)(iVar28 + 1));
          }
          else {
            uVar16 = (int)(short)((int)((uint)(ushort)((short)uVar16 >> 0xf) << 0x10 |
                                       uVar16 & 0xffff) / (int)(short)lVar30) + uVar15;
            if ((uVar9 == 0x16) && (iVar28 == 1)) {
LAB_001ce61f:
              if ((TERRITORY_BOUNDARIES[(int)(iVar7 + uVar16)].flags & 0x400) == 0) {
                uVar2 = *(undefined1 *)((long)&z.fminy + (ulong)(iVar27 - 4));
                *(undefined1 *)((long)&z.fminy + (ulong)(iVar27 - 4)) =
                     *(undefined1 *)((long)&z.fminy + (ulong)(iVar27 - 3));
                *(undefined1 *)((long)&z.fminy + (ulong)(iVar27 - 3)) = uVar2;
              }
              if (0x1f < iVar11) goto LAB_001ce6ba;
            }
          }
          iVar18 = decodeBase31((char *)&z);
          if (0 < (int)uVar16) {
            if (uVar16 < uVar15) {
              uVar15 = uVar16;
            }
            iVar18 = iVar18 + (uVar15 + iVar28 * uVar16) * -0xe1781;
          }
        }
        iVar7 = uVar16 + iVar7;
        iVar27 = TERRITORY_BOUNDARIES[iVar7].flags >> 0x10;
        if (((uint)TERRITORY_BOUNDARIES[iVar7].flags >> 10 & 1) == 0) {
          local_34 = iVar18 / iVar27;
          iVar18 = iVar18 % iVar27;
        }
        else {
          iVar28 = (TERRITORY_BOUNDARIES[iVar7].maxy - TERRITORY_BOUNDARIES[iVar7].miny) / 0x5a;
          iVar11 = iVar28 + 1;
          iVar27 = (int)((long)(ulong)(uint)(iVar27 * iVar27) / (long)iVar11);
          decodeSixWide(iVar18,iVar27,iVar11,&local_34,&local_38);
          iVar18 = iVar28 - local_38;
        }
        if (iVar27 <= local_34) {
          MVar6 = ERR_MAPCODE_UNDECODABLE;
          goto LAB_001ce7d4;
        }
        uVar16 = TERRITORY_BOUNDARIES[iVar7].miny;
        iVar28 = TERRITORY_BOUNDARIES[iVar7].maxy;
        uVar15 = uVar16;
        if ((int)uVar16 < 0) {
          iVar11 = 0x168;
          if (iVar28 < 0) {
            uVar15 = -iVar28;
            goto LAB_001ce789;
          }
        }
        else {
LAB_001ce789:
          iVar11 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar15 >> 0x13) * 4);
        }
        iVar27 = (local_34 * iVar11) % 4;
        (dec->coord32).lonMicroDeg = (local_34 * iVar11) / 4 + TERRITORY_BOUNDARIES[iVar7].minx;
        (dec->coord32).latMicroDeg = iVar28 + iVar18 * -0x5a;
        maxLon32 = TERRITORY_BOUNDARIES[iVar7].maxx;
        iVar28 = -0x5a;
        goto LAB_001ce7cd;
      }
    }
    else if ((uVar9 == 0x16 && local_d0 == 0) || (uVar9 == 0x17 && uVar15 == 0x21)) {
      pcVar13 = dec->mapcode;
      pcVar14 = strchr(pcVar13,0x2e);
      if (pcVar14 == (char *)0x0) {
        MVar6 = ERR_DOT_MISSING;
        goto LAB_001ce47b;
      }
      iVar27 = decodeBase31(pcVar13);
      iVar27 = iVar27 * 0x745f;
      iVar7 = 0xe1781;
      if (0x16 < uVar9) {
        iVar7 = 0x1b4d89f;
      }
      iVar28 = 0;
      goto LAB_001ce157;
    }
    piVar25 = piVar25 + 5;
    lVar30 = lVar30 + 0x100000000;
  }
  goto LAB_001ce478;
LAB_001ce53e:
  if ((long)uVar24 <= (long)uVar23) goto LAB_001ce566;
  if (((pTVar26->flags & 0x200) == 0) &&
     (iVar27 = fitsInsideBoundaries(&dec->coord32,pTVar26), iVar27 != 0)) goto LAB_001ce7ec;
  pTVar26 = pTVar26 + -1;
  uVar24 = uVar24 - 1;
  goto LAB_001ce53e;
LAB_001ce566:
  pTVar26 = TERRITORY_BOUNDARIES + uVar23;
  iVar27 = 0;
  for (; (long)uVar23 < lVar30 >> 0x20; uVar23 = uVar23 + 1) {
    if (((pTVar26->flags & 0x200) == 0) && (iVar7 = restrictZoneTo(&z,pMVar29,pTVar26), iVar7 != 0))
    {
      if (iVar27 != 0) {
        iVar27 = iVar27 + 1;
        break;
      }
      local_a8 = (double)CONCAT44(z.fminy._4_4_,z.fminy._0_4_);
      dStack_a0 = z.fmaxy;
      local_88 = z.fminx;
      dStack_80 = z.fmaxx;
      iVar27 = 1;
    }
    pTVar26 = pTVar26 + 1;
  }
  MVar6 = ERR_MAPCODE_UNDECODABLE;
  if (iVar27 == 0) goto LAB_001ce47b;
  if (iVar27 == 1) {
    (dec->zone).fminy = local_a8;
    (dec->zone).fmaxy = dStack_a0;
    (dec->zone).fminx = local_88;
    (dec->zone).fmaxx = dStack_80;
  }
LAB_001ce7ec:
  MVar6 = ERR_MAPCODE_UNDECODABLE;
  pMVar29 = &dec->zone;
  restrictZoneTo(pMVar29,pMVar29,TERRITORY_BOUNDARIES + lVar17);
  iVar27 = isEmpty(pMVar29);
  if (iVar27 == 0) {
    PVar33 = getMidPointFractions(pMVar29);
    PVar33 = (Point)divpd((undefined1  [16])PVar33,_DAT_00254de0);
    dec->result = PVar33;
    dVar31 = -90.0;
    if ((PVar33.lat < -90.0) || (dVar31 = 90.0, 90.0 < PVar33.lat)) {
      (dec->result).lat = dVar31;
    }
    dVar32 = PVar33.lon;
    dVar31 = (double)(~-(ulong)(dVar32 < -180.0) & (ulong)dVar32 |
                     (ulong)(dVar32 + 360.0) & -(ulong)(dVar32 < -180.0));
    if ((dVar32 < -180.0) || (180.0 <= dVar31)) {
      (dec->result).lon =
           (double)(~-(ulong)(180.0 <= dVar31) & (ulong)dVar31 |
                   (ulong)(dVar31 + -360.0) & -(ulong)(180.0 <= dVar31));
    }
    if (bVar5) {
      return ERR_OK;
    }
    repackIfAllDigits(__s,0);
    return ERR_OK;
  }
  goto LAB_001ce47b;
LAB_001ce157:
  do {
    uVar15 = coDex((int)uVar24);
    if ((uVar15 != uVar9) || (((uint)*piVar25 >> 8 & 1) == 0)) goto LAB_001ce478;
    uVar16 = piVar25[-3];
    uVar15 = piVar25[-1];
    uVar10 = uVar16;
    if ((int)uVar16 < 0) {
      iVar11 = 0x168;
      if ((int)uVar15 < 0) {
        uVar10 = -uVar15;
        goto LAB_001ce198;
      }
    }
    else {
LAB_001ce198:
      iVar11 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar10 >> 0x13) * 4);
    }
    uVar10 = ((TerritoryBoundary *)(piVar25 + -4))->minx;
    maxLon32 = piVar25[-2];
    iVar22 = maxLon32 - uVar10;
    iVar18 = ((int)((uVar15 - uVar16) + 0x59) / 0x5a + 0xaf) / 0xb0;
    iVar11 = ((iVar11 + iVar22 * 4 + -1) / iVar11 + 0xa7) / 0xa8;
    iVar21 = iVar18 * iVar11 * 0x745f;
    if ((*piVar25 & 0x180U) == 0x100) {
      iVar21 = iVar21 + iVar28 + iVar7 + -1;
      iVar21 = iVar21 - (iVar21 % iVar7 + iVar28);
    }
    iVar20 = iVar27 - iVar28;
    bVar4 = iVar27 < iVar28;
    iVar28 = iVar28 + iVar21;
    piVar25 = piVar25 + 5;
    uVar24 = (ulong)((int)uVar24 + 1);
  } while (iVar28 <= iVar27 || bVar4);
  iVar11 = iVar11 * 0xa8;
  iVar11 = (iVar22 + iVar11 + -1) / iVar11;
  iVar28 = (int)((uVar15 - uVar16) + iVar18 * 0xb0 + -1) / (iVar18 * 0xb0);
  uVar24 = (long)iVar20 / 0x745f;
  decodeTriple(pcVar14 + 1,(int *)&z,(int *)input);
  uVar24 = (ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff;
  iVar27 = ((int)((long)uVar24 % (long)iVar18) * 0xb0 + input._0_4_) * iVar28;
  iVar21 = uVar15 - iVar27;
  (dec->coord32).latMicroDeg = iVar21;
  iVar7 = ((int)((long)uVar24 / (long)iVar18) * 0xa8 + z.fminy._0_4_) * iVar11;
  iVar18 = uVar10 + iVar7;
  (dec->coord32).lonMicroDeg = iVar18;
  if ((((-1 < iVar7) && (iVar18 < (int)maxLon32)) && ((int)uVar16 <= iVar21)) && (-1 < iVar27)) {
    iVar11 = iVar11 << 2;
    iVar28 = -iVar28;
    iVar27 = 0;
LAB_001ce7cd:
    MVar6 = decodeExtension(dec,iVar11,iVar28,iVar27,uVar16,maxLon32);
LAB_001ce7d4:
    if (MVar6 != ERR_OK) goto LAB_001ce47b;
    lVar17 = (long)(int)lVar17;
    goto LAB_001ce7ec;
  }
LAB_001ce478:
  MVar6 = ERR_MAPCODE_UNDECODABLE;
LAB_001ce47b:
  (dec->result).lat = 0.0;
  (dec->result).lon = 0.0;
  return MVar6;
}

Assistant:

static enum MapcodeError decoderEngine(DecodeRec *dec, int parseFlags) {
    enum Territory ccode;
    enum MapcodeError err;
    int codex;
    int from;
    int upto;
    int i;
    char *s;
    int wasAllDigits = 0;
    ASSERT(dec);

    err = parseMapcodeString(&dec->mapcodeElements, dec->orginput, parseFlags, dec->context);
    if (err) { // clear all parsed fields in case of error
        dec->mapcodeElements.territoryISO[0] = 0;
        dec->mapcodeElements.properMapcode[0] = 0;
        dec->mapcodeElements.precisionExtension[0] = 0;
        return err;
    }

    ccode = dec->mapcodeElements.territoryCode;
    dec->context = ccode;
    dec->mapcode = dec->mapcodeElements.properMapcode;
    dec->extension = dec->mapcodeElements.precisionExtension;
    codex = dec->mapcodeElements.indexOfDot * 9 + (int) strlen(dec->mapcodeElements.properMapcode) - 1;
    s = dec->mapcodeElements.properMapcode;

    if (strchr(s, 'A') || strchr(s, 'E') || strchr(s, 'U')) {
        if (unpackIfAllDigits(s) <= 0) {
            return ERR_INVALID_VOWEL;
        }
        wasAllDigits = 1;
    }

    if (codex > 54) {
        ASSERT(codex == 55);
        return ERR_MAPCODE_UNDECODABLE;
    } else if (codex == 54) {
        // international mapcodes must be in international context
        ccode = TERRITORY_AAA;
    } else if (ccode < _TERRITORY_MIN) {
        return ERR_MISSING_TERRITORY;
    } else if (isSubdivision(ccode)) {
        // int mapcodes must be interpreted in the parent of a subdivision
        enum Territory parent = parentTerritoryOf(ccode);
        if ((codex == 44) || ((codex == 34 || codex == 43) && (parent == TERRITORY_IND || parent == TERRITORY_MEX))) {
            ccode = parent;
        }
    }

    from = firstRec(ccode);
    upto = lastRec(ccode);

    // try all ccode rectangles to decode s (pointing to first character of proper mapcode), assume not decodable
    err = ERR_MAPCODE_UNDECODABLE;
    for (i = from; i <= upto; i++) {
        const int codexi = coDex(i);
        const int r = REC_TYPE(i);
        if (r == 0) {
            if (IS_NAMELESS(i)) {
                if (((codexi == 21) && (codex == 22)) ||
                    ((codexi == 22) && (codex == 32)) ||
                    ((codexi == 13) && (codex == 23))) {
                    err = decodeNameless(dec, i);
                    break;
                }
            } else {
                if ((codexi == codex) || ((codex == 22) && (codexi == 21))) {
                    err = decodeGrid(dec, i, 0);

                    // first of all, make sure the zone fits the country
                    restrictZoneTo(&dec->zone, &dec->zone, TERRITORY_BOUNDARY(upto));

                    if ((err == ERR_OK) && IS_RESTRICTED(i)) {
                        int nrZoneOverlaps = 0;
                        int j;

                        // *** make sure decode fits somewhere ***
                        dec->result = getMidPointFractions(&dec->zone);
                        dec->coord32 = convertFractionsToCoord32(&dec->result);
                        for (j = i - 1; j >= from; j--) { // look in previous rects
                            if (!IS_RESTRICTED(j)) {
                                if (fitsInsideBoundaries(&dec->coord32, TERRITORY_BOUNDARY(j))) {
                                    nrZoneOverlaps = 1;
                                    break;
                                }
                            }
                        }

                        if (!nrZoneOverlaps) {
                            MapcodeZone zfound;
                            TerritoryBoundary prevu;
                            for (j = from; j < i; j++) { // try all smaller rectangles j
                                if (!IS_RESTRICTED(j)) {
                                    MapcodeZone z;
                                    if (restrictZoneTo(&z, &dec->zone, TERRITORY_BOUNDARY(j))) {
                                        nrZoneOverlaps++;
                                        if (nrZoneOverlaps == 1) {
                                            // first fit! remember...
                                            zoneCopyFrom(&zfound, &z);
                                            ASSERT(j <= MAPCODE_BOUNDARY_MAX);
                                            memcpy(&prevu, TERRITORY_BOUNDARY(j), sizeof(TerritoryBoundary));
                                        } else { // nrZoneOverlaps >= 2
                                            // more than one hit
                                            break; // give up
                                        }
                                    }
                                } // IS_RESTRICTED
                            } // for j

                            // if several sub-areas intersect, just return the whole zone
                            // (the center of which may NOT re-encode to the same mapcode!)
                            if (nrZoneOverlaps == 1) { // found exactly ONE intersection?
                                zoneCopyFrom(&dec->zone, &zfound);
                            }
                        }

                        if (!nrZoneOverlaps) {
                            err = ERR_MAPCODE_UNDECODABLE; // type 3 "NLD L222.222"
                        }
                    }  // *** make sure decode fits somewhere ***
                    break;
                }
            }
        } else if (r == 1) {
            if (codex == codexi + 10 && HEADER_LETTER(i) == *s) {
                err = decodeGrid(dec, i, 1);
                break;
            }
        } else { //r>1
            if (((codex == 23) && (codexi == 22)) ||
                ((codex == 33) && (codexi == 23))) {
                err = decodeAutoHeader(dec, i);
                break;
            }
        }
    } // for

    if (!err) {
        restrictZoneTo(&dec->zone, &dec->zone, TERRITORY_BOUNDARY(lastRec(ccode)));

        if (isEmpty(&dec->zone)) {
            err = ERR_MAPCODE_UNDECODABLE; // type 0 "BRA xx.xx"
        }
    }

    if (err) {
        dec->result.lat = dec->result.lon = 0;
        return err;
    }

    dec->result = getMidPointFractions(&dec->zone);
    dec->result = convertFractionsToDegrees(&dec->result);

    // normalise between =180 and 180
    if (dec->result.lat < -90.0) {
        dec->result.lat = -90.0;
    }
    if (dec->result.lat > 90.0) {
        dec->result.lat = 90.0;
    }
    if (dec->result.lon < -180.0) {
        dec->result.lon += 360.0;
    }
    if (dec->result.lon >= 180.0) {
        dec->result.lon -= 360.0;
    }

    if (wasAllDigits) {
        repackIfAllDigits(dec->mapcodeElements.properMapcode, 0);
    }
    return ERR_OK;
}